

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O0

void __thiscall icu_63::MeasureUnit::initCurrency(MeasureUnit *this,char *isoCurrency)

{
  int32_t iVar1;
  int32_t result;
  char *isoCurrency_local;
  MeasureUnit *this_local;
  
  iVar1 = binarySearch((char **)gTypes,0,0x14,"currency");
  this->fTypeId = iVar1;
  iVar1 = binarySearch((char **)gSubTypes,*(int32_t *)(gOffsets + (long)this->fTypeId * 4),
                       *(int32_t *)(gOffsets + (long)(this->fTypeId + 1) * 4),isoCurrency);
  if (iVar1 == -1) {
    strncpy(this->fCurrency,isoCurrency,4);
    this->fCurrency[3] = '\0';
  }
  else {
    this->fSubTypeId = iVar1 - *(int *)(gOffsets + (long)this->fTypeId * 4);
  }
  return;
}

Assistant:

void MeasureUnit::initCurrency(const char *isoCurrency) {
    int32_t result = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), "currency");
    U_ASSERT(result != -1);
    fTypeId = result;
    result = binarySearch(
            gSubTypes, gOffsets[fTypeId], gOffsets[fTypeId + 1], isoCurrency);
    if (result != -1) {
        fSubTypeId = result - gOffsets[fTypeId];
    } else {
        uprv_strncpy(fCurrency, isoCurrency, UPRV_LENGTHOF(fCurrency));
        fCurrency[3] = 0;
    }
}